

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_read_string(mbedtls_mpi *X,int radix,char *s)

{
  size_t sVar1;
  undefined1 local_70 [8];
  mbedtls_mpi T;
  mbedtls_mpi_uint d;
  size_t n;
  size_t slen;
  size_t j;
  size_t i;
  int ret;
  char *s_local;
  int radix_local;
  mbedtls_mpi *X_local;
  
  if ((radix < 2) || (0x10 < radix)) {
    X_local._4_4_ = -4;
  }
  else {
    mbedtls_mpi_init((mbedtls_mpi *)local_70);
    sVar1 = strlen(s);
    if (radix == 0x10) {
      if (0x3fffffffffffffff < sVar1) {
        return -4;
      }
      i._4_4_ = mbedtls_mpi_grow(X,((sVar1 << 2) >> 6) + (long)(int)(uint)((sVar1 & 0xf) != 0));
      if ((i._4_4_ == 0) && (i._4_4_ = mbedtls_mpi_lset(X,0), i._4_4_ == 0)) {
        slen = 0;
        for (j = sVar1; j != 0; j = j - 1) {
          if ((j == 1) && (*s == '-')) {
            X->s = -1;
            break;
          }
          i._4_4_ = mpi_get_digit((mbedtls_mpi_uint *)&T.p,0x10,s[j - 1]);
          if (i._4_4_ != 0) break;
          X->p[slen >> 4] = (long)T.p << (sbyte)((slen & 0xf) << 2) | X->p[slen >> 4];
          slen = slen + 1;
        }
      }
    }
    else {
      i._4_4_ = mbedtls_mpi_lset(X,0);
      if (i._4_4_ == 0) {
        for (j = 0; j < sVar1; j = j + 1) {
          if ((j == 0) && (*s == '-')) {
            X->s = -1;
          }
          else {
            i._4_4_ = mpi_get_digit((mbedtls_mpi_uint *)&T.p,radix,s[j]);
            if ((i._4_4_ != 0) ||
               (i._4_4_ = mbedtls_mpi_mul_int((mbedtls_mpi *)local_70,X,(long)radix), i._4_4_ != 0))
            break;
            if (X->s == 1) {
              i._4_4_ = mbedtls_mpi_add_int(X,(mbedtls_mpi *)local_70,(mbedtls_mpi_sint)T.p);
            }
            else {
              i._4_4_ = mbedtls_mpi_sub_int(X,(mbedtls_mpi *)local_70,(mbedtls_mpi_sint)T.p);
            }
            if (i._4_4_ != 0) break;
          }
        }
      }
    }
    mbedtls_mpi_free((mbedtls_mpi *)local_70);
    X_local._4_4_ = i._4_4_;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_read_string( mbedtls_mpi *X, int radix, const char *s )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j, slen, n;
    mbedtls_mpi_uint d;
    mbedtls_mpi T;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( s != NULL );

    if( radix < 2 || radix > 16 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &T );

    slen = strlen( s );

    if( radix == 16 )
    {
        if( slen > MPI_SIZE_T_MAX >> 2 )
            return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

        n = BITS_TO_LIMBS( slen << 2 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, n ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

        for( i = slen, j = 0; i > 0; i--, j++ )
        {
            if( i == 1 && s[i - 1] == '-' )
            {
                X->s = -1;
                break;
            }

            MBEDTLS_MPI_CHK( mpi_get_digit( &d, radix, s[i - 1] ) );
            X->p[j / ( 2 * ciL )] |= d << ( ( j % ( 2 * ciL ) ) << 2 );
        }
    }
    else
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

        for( i = 0; i < slen; i++ )
        {
            if( i == 0 && s[i] == '-' )
            {
                X->s = -1;
                continue;
            }

            MBEDTLS_MPI_CHK( mpi_get_digit( &d, radix, s[i] ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T, X, radix ) );

            if( X->s == 1 )
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, &T, d ) );
            }
            else
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( X, &T, d ) );
            }
        }
    }

cleanup:

    mbedtls_mpi_free( &T );

    return( ret );
}